

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O1

string<wchar_t> * __thiscall
irr::core::string<wchar_t>::subString
          (string<wchar_t> *__return_storage_ptr__,string<wchar_t> *this,u32 begin,s32 length,
          bool make_lower)

{
  int iVar1;
  size_type sVar2;
  pointer pwVar3;
  long lVar4;
  int iVar5;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  if ((length < 1) || ((uint)(this->str)._M_string_length <= begin)) {
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = L'\0';
    operator=(__return_storage_ptr__,"");
  }
  else {
    ::std::__cxx11::wstring::substr((ulong)&local_38,(ulong)this);
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    ::std::__cxx11::wstring::_M_construct<wchar_t*>
              ((wstring *)__return_storage_ptr__,local_38,(long)local_38 + local_30 * 4);
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] * 4 + 4);
    }
    if ((make_lower) && (sVar2 = (__return_storage_ptr__->str)._M_string_length, sVar2 != 0)) {
      pwVar3 = (__return_storage_ptr__->str)._M_dataplus._M_p;
      lVar4 = 0;
      do {
        iVar1 = *(int *)((long)pwVar3 + lVar4);
        iVar5 = iVar1 + 0x20;
        if (0x19 < iVar1 - 0x41U) {
          iVar5 = iVar1;
        }
        *(int *)((long)pwVar3 + lVar4) = iVar5;
        lVar4 = lVar4 + 4;
      } while (sVar2 << 2 != lVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string<T> subString(u32 begin, s32 length, bool make_lower = false) const
	{
		// if start after string
		// or no proper substring length
		if ((length <= 0) || (begin >= size()))
			return string<T>("");

		string<T> o = str.substr(begin, length);
		if (make_lower)
			o.make_lower();
		return o;
	}